

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O1

void __thiscall
NativeCodeGenerator::PrioritizedButNotYetProcessed(NativeCodeGenerator *this,Job *job)

{
  ThreadContextId pvVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContextId pvVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  QueuedFullJitWorkItem *element;
  CodeGenWorkItem *this_00;
  
  pvVar1 = this->mainThreadId;
  pvVar4 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar1 != pvVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x70e,"(mainThreadId == GetCurrentThreadContextId())",
                       "Cannot use this member of native code generator from thread other than the creating context\'s current thread"
                      );
    if (!bVar3) goto LAB_00600efc;
    *puVar5 = 0;
  }
  if (job == (Job *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x70f,"(job)","job");
    if (!bVar3) {
LAB_00600efc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00 = (CodeGenWorkItem *)&job[-1].isCritical;
  if (job == (Job *)0x0) {
    this_00 = (CodeGenWorkItem *)0x0;
  }
  if (((this_00->jitData).type == '\0') && (this_00->isInJitQueue == true)) {
    pSVar6 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this_00->functionBody);
    pSVar6->interpretedCallsHighPri = pSVar6->interpretedCallsHighPri + 1;
    if ((this_00->jitData).jitMode == '\x04') {
      element = CodeGenWorkItem::GetQueuedFullJitWorkItem(this_00);
      if (element != (QueuedFullJitWorkItem *)0x0) {
        JsUtil::DoublyLinkedListElement<QueuedFullJitWorkItem,_Memory::ArenaAllocator>::
        MoveToBeginning<QueuedFullJitWorkItem>
                  (element,&(this->queuedFullJitWorkItems).head,&(this->queuedFullJitWorkItems).tail
                  );
        return;
      }
    }
  }
  return;
}

Assistant:

void
NativeCodeGenerator::PrioritizedButNotYetProcessed(JsUtil::Job *const job)
{
    // This function is called from inside the lock

    ASSERT_THREAD();
    Assert(job);

    CodeGenWorkItem *const codeGenWorkItem = static_cast<CodeGenWorkItem *>(job);
    if(codeGenWorkItem->Type() == JsFunctionType && codeGenWorkItem->IsInJitQueue())
    {
#ifdef BGJIT_STATS
        codeGenWorkItem->GetScriptContext()->interpretedCallsHighPri++;
#endif
        if(codeGenWorkItem->GetJitMode() == ExecutionMode::FullJit)
        {
            QueuedFullJitWorkItem *const queuedFullJitWorkItem = codeGenWorkItem->GetQueuedFullJitWorkItem();
            if(queuedFullJitWorkItem)
            {
                queuedFullJitWorkItems.MoveToBeginning(queuedFullJitWorkItem);
            }
        }
    }
}